

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter.c
# Opt level: O0

void filter8(int8_t mask,uint8_t thresh,int8_t flat,uint8_t *op3,uint8_t *op2,uint8_t *op1,
            uint8_t *op0,uint8_t *oq0,uint8_t *oq1,uint8_t *oq2,uint8_t *oq3)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte *in_RCX;
  char in_DL;
  undefined1 in_SIL;
  char in_DIL;
  byte *in_R8;
  byte *in_R9;
  uint8_t q3;
  uint8_t q2;
  uint8_t q1;
  uint8_t q0;
  uint8_t p0;
  uint8_t p1;
  uint8_t p2;
  uint8_t p3;
  undefined5 in_stack_00000020;
  byte *in_stack_00000028;
  undefined5 in_stack_fffffffffffffff8;
  
  if ((in_DL == '\0') || (in_DIL == '\0')) {
    filter4(p3,p2,(uint8_t *)
                  CONCAT17(in_DIL,CONCAT16(in_SIL,CONCAT15(in_DL,in_stack_fffffffffffffff8))),in_RCX
            ,in_R8,in_R9);
  }
  else {
    bVar1 = *in_RCX;
    bVar2 = *in_R8;
    bVar3 = *in_R9;
    bVar4 = *op1;
    bVar5 = *op2;
    bVar6 = *op3;
    bVar7 = *(byte *)CONCAT17(mask,CONCAT16(thresh,CONCAT15(flat,in_stack_00000020)));
    bVar8 = *in_stack_00000028;
    *in_R8 = (byte)((int)((uint)bVar1 + (uint)bVar1 + (uint)bVar1 + (uint)bVar2 * 2 + (uint)bVar3 +
                          (uint)bVar4 + (uint)bVar5 + 4) >> 3);
    *in_R9 = (byte)((int)((uint)bVar1 + (uint)bVar1 + (uint)bVar2 + (uint)bVar3 * 2 + (uint)bVar4 +
                          (uint)bVar5 + (uint)bVar6 + 4) >> 3);
    *op1 = (uint8_t)((int)((uint)bVar1 + (uint)bVar2 + (uint)bVar3 + (uint)bVar4 * 2 + (uint)bVar5 +
                           (uint)bVar6 + (uint)bVar7 + 4) >> 3);
    *op2 = (uint8_t)((int)((uint)bVar2 + (uint)bVar3 + (uint)bVar4 + (uint)bVar5 * 2 + (uint)bVar6 +
                           (uint)bVar7 + (uint)bVar8 + 4) >> 3);
    *op3 = (uint8_t)((int)((uint)bVar3 + (uint)bVar4 + (uint)bVar5 + (uint)bVar6 * 2 + (uint)bVar7 +
                           (uint)bVar8 + (uint)bVar8 + 4) >> 3);
    *(char *)CONCAT17(mask,CONCAT16(thresh,CONCAT15(flat,in_stack_00000020))) =
         (char)((int)((uint)bVar4 + (uint)bVar5 + (uint)bVar6 + (uint)bVar7 * 2 + (uint)bVar8 +
                      (uint)bVar8 + (uint)bVar8 + 4) >> 3);
  }
  return;
}

Assistant:

static inline void filter8(int8_t mask, uint8_t thresh, int8_t flat,
                           uint8_t *op3, uint8_t *op2, uint8_t *op1,
                           uint8_t *op0, uint8_t *oq0, uint8_t *oq1,
                           uint8_t *oq2, uint8_t *oq3) {
  if (flat && mask) {
    const uint8_t p3 = *op3, p2 = *op2, p1 = *op1, p0 = *op0;
    const uint8_t q0 = *oq0, q1 = *oq1, q2 = *oq2, q3 = *oq3;

    // 7-tap filter [1, 1, 1, 2, 1, 1, 1]
    *op2 = ROUND_POWER_OF_TWO(p3 + p3 + p3 + 2 * p2 + p1 + p0 + q0, 3);
    *op1 = ROUND_POWER_OF_TWO(p3 + p3 + p2 + 2 * p1 + p0 + q0 + q1, 3);
    *op0 = ROUND_POWER_OF_TWO(p3 + p2 + p1 + 2 * p0 + q0 + q1 + q2, 3);
    *oq0 = ROUND_POWER_OF_TWO(p2 + p1 + p0 + 2 * q0 + q1 + q2 + q3, 3);
    *oq1 = ROUND_POWER_OF_TWO(p1 + p0 + q0 + 2 * q1 + q2 + q3 + q3, 3);
    *oq2 = ROUND_POWER_OF_TWO(p0 + q0 + q1 + 2 * q2 + q3 + q3 + q3, 3);
  } else {
    filter4(mask, thresh, op1, op0, oq0, oq1);
  }
}